

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O1

MemorySectionLimits __thiscall
Wasm::WasmBinaryReader::ReadSectionLimitsBase<Wasm::MemorySectionLimits>
          (WasmBinaryReader *this,uint32 maxInitial,uint32 maxMaximum,char16 *errorMsg)

{
  uint uVar1;
  uint32 uVar2;
  char16_t *msg;
  WasmBinaryReader *pWVar3;
  MemorySectionLimits MVar4;
  uint32 local_34 [2];
  uint32 length;
  
  local_34[0] = 0;
  MVar4.super_SectionLimits.flags = LEB128<unsigned_int,32u>(this,local_34);
  pWVar3 = this;
  uVar1 = LEB128<unsigned_int,32u>(this,local_34);
  uVar2 = maxMaximum;
  if ((MVar4.super_SectionLimits.flags & 1) != 0) {
    uVar2 = LEB128<unsigned_int,32u>(this,local_34);
    pWVar3 = this;
    if (maxMaximum < uVar2) {
      msg = L"Maximum %s";
      goto LAB_00f2a92e;
    }
  }
  if (uVar1 <= maxInitial) {
    MVar4.super_SectionLimits.initial = uVar1;
    MVar4.super_SectionLimits.maximum = uVar2;
    return (MemorySectionLimits)MVar4.super_SectionLimits;
  }
  msg = L"Minimum %s";
  this = pWVar3;
LAB_00f2a92e:
  ThrowDecodingError(this,msg,errorMsg);
}

Assistant:

SectionLimitType WasmBinaryReader::ReadSectionLimitsBase(uint32 maxInitial, uint32 maxMaximum, const char16* errorMsg)
{
    SectionLimitType limits;
    uint32 length = 0;
    limits.flags = (SectionLimits::Flags)LEB128(length);
    limits.initial = LEB128(length);
    limits.maximum = maxMaximum;
    if (limits.HasMaximum())
    {
        limits.maximum = LEB128(length);
        if (limits.maximum > maxMaximum)
        {
            ThrowDecodingError(_u("Maximum %s"), errorMsg);
        }
    }
    if (limits.initial > maxInitial)
    {
        ThrowDecodingError(_u("Minimum %s"), errorMsg);
    }
    return limits;
}